

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatetimeParser.cpp
# Opt level: O2

bool __thiscall DatetimeParser::parse_time_off(DatetimeParser *this,Pig *pig)

{
  bool bVar1;
  uint c;
  size_type previous;
  
  previous = Pig::cursor(pig);
  bVar1 = parse_time(this,pig,false);
  if ((((bVar1) && (bVar1 = parse_off(this,pig), bVar1)) && (c = Pig::peek(pig), c != 0x2d)) &&
     (bVar1 = unicodeLatinDigit(c), !bVar1)) {
    return true;
  }
  Pig::restoreTo(pig,previous);
  return false;
}

Assistant:

bool DatetimeParser::parse_time_off (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  if (parse_time (pig, false) &&
      parse_off (pig))
  {
    auto terminator = pig.peek ();
    if (terminator != '-' && ! unicodeLatinDigit (terminator))
    {
      return true;
    }
  }

  pig.restoreTo (checkpoint);
  return false;
}